

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O3

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::standard_hash_table
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,uint32_t capa_bits)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 in_XMM1 [16];
  
  uVar2 = 6;
  if (6 < capa_bits) {
    uVar2 = (ulong)capa_bits;
  }
  (this->table_).
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table_).
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_).
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size_ = 0;
  uVar4 = -1L << (uVar2 & 0x3f);
  (this->capa_size_).bits_ = (uint32_t)uVar2;
  (this->capa_size_).mask_ = ~uVar4;
  auVar1 = vcvtusi2sd_avx512f(in_XMM1,uVar4 * -0x50);
  auVar5._0_8_ = auVar1._0_8_ / 100.0;
  auVar5._8_8_ = auVar1._8_8_;
  uVar3 = vcvttsd2usi_avx512f(auVar5);
  this->max_size_ = uVar3;
  std::
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ::resize(&this->table_,-uVar4);
  return;
}

Assistant:

explicit standard_hash_table(uint32_t capa_bits) {
        capa_size_ = size_p2(std::max(min_capa_bits, capa_bits));
        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);
        table_.resize(capa_size_.size());
    }